

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-heavy-traffic-deadlock-bug.c
# Opt level: O0

void do_writes_and_reads(uv_stream_t *handle)

{
  int iVar1;
  ulong uStack_18;
  int r;
  size_t i;
  uv_stream_t *handle_local;
  
  bytes_written = 0;
  bytes_read = 0;
  for (uStack_18 = 0; uStack_18 < 0x100; uStack_18 = uStack_18 + 1) {
    do_write(handle);
  }
  iVar1 = uv_read_start(handle,alloc_cb,read_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-heavy-traffic-deadlock-bug.c"
            ,0x7c,"r == 0");
    abort();
  }
  iVar1 = uv_run(handle->loop,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-heavy-traffic-deadlock-bug.c"
            ,0x7f,"r == 0");
    abort();
  }
  if (bytes_written != 0x600000) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-heavy-traffic-deadlock-bug.c"
            ,0x81,"bytes_written == XFER_SIZE");
    abort();
  }
  if (bytes_read != 0x600000) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-heavy-traffic-deadlock-bug.c"
            ,0x82,"bytes_read == XFER_SIZE");
    abort();
  }
  return;
}

Assistant:

static void do_writes_and_reads(uv_stream_t* handle) {
  size_t i;
  int r;

  bytes_written = 0;
  bytes_read = 0;

  for (i = 0; i < NUM_WRITES; i++) {
    do_write(handle);
  }

  r = uv_read_start(handle, alloc_cb, read_cb);
  ASSERT(r == 0);

  r = uv_run(handle->loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(bytes_written == XFER_SIZE);
  ASSERT(bytes_read == XFER_SIZE);
}